

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

Bool write_nrx4_reg(Emulator *e,Channel *channel,Address addr,u8 value,u16 max_length)

{
  byte bVar1;
  undefined7 in_register_00000009;
  uint uVar2;
  Bool BVar3;
  undefined6 in_register_00000012;
  u16 uVar4;
  Bool BVar5;
  
  uVar2 = (uint)CONCAT62(in_register_00000012,addr);
  bVar1 = (byte)addr;
  BVar5 = channel->length_enabled;
  BVar3 = uVar2 >> 6 & TRUE;
  channel->length_enabled = BVar3;
  *(byte *)((long)&channel->frequency + 1) = bVar1 & 7;
  if (((BVar3 == FALSE || ((ulong)e & 1) != 0) || BVar5 != FALSE) || (channel->length == 0)) {
LAB_0010d9fb:
    if (-1 < (char)bVar1) goto LAB_0010da2d;
    if (channel->length == 0) {
      uVar4 = (u16)CONCAT71(in_register_00000009,value);
      channel->length = uVar4;
      if (BVar3 != FALSE && ((ulong)e & 1) == 0) {
        channel->length = uVar4 - 1;
      }
    }
    BVar5 = TRUE;
    if (channel->dac_enabled == FALSE) goto LAB_0010da2d;
  }
  else {
    uVar4 = channel->length - 1;
    channel->length = uVar4;
    BVar5 = FALSE;
    if ((char)bVar1 < '\0' || uVar4 != 0) goto LAB_0010d9fb;
  }
  channel->status = BVar5;
LAB_0010da2d:
  return uVar2 >> 7;
}

Assistant:

static Bool write_nrx4_reg(Emulator* e, Channel* channel, Address addr,
                           u8 value, u16 max_length) {
  Bool trigger = UNPACK(value, NRX4_INITIAL);
  Bool was_length_enabled = channel->length_enabled;
  channel->length_enabled = UNPACK(value, NRX4_LENGTH_ENABLED);
  channel->frequency &= 0xff;
  channel->frequency |= UNPACK(value, NRX4_FREQUENCY_HI) << 8;

  /* Extra length clocking occurs on NRX4 writes if the next APU frame isn't a
   * length counter frame. This only occurs on transition from disabled to
   * enabled. */
  Bool next_frame_is_length = (APU.frame & 1) == 1;
  if (UNLIKELY(!was_length_enabled && channel->length_enabled &&
               !next_frame_is_length && channel->length > 0)) {
    channel->length--;
    HOOK(write_nrx4_extra_length_clock_abi, addr, value, channel->length);
    if (!trigger && channel->length == 0) {
      HOOK(write_nrx4_disable_channel_ab, addr, value);
      channel->status = FALSE;
    }
  }

  if (trigger) {
    if (channel->length == 0) {
      channel->length = max_length;
      if (channel->length_enabled && !next_frame_is_length) {
        channel->length--;
      }
      HOOK(write_nrx4_trigger_new_length_abi, addr, value, channel->length);
    }
    if (channel->dac_enabled) {
      channel->status = TRUE;
    }
  }

  HOOK(write_nrx4_info_abii, addr, value, trigger, channel->length_enabled);
  return trigger;
}